

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O3

PShm * p_shm_new(pchar *name,psize size,PShmAccessPerms perms,PError **error)

{
  int __fd;
  pint pVar1;
  int iVar2;
  PErrorIPC PVar3;
  int iVar4;
  PShm *shm;
  size_t sVar5;
  char *pcVar6;
  pchar *ppVar7;
  void *pvVar8;
  PSemaphore *pPVar9;
  stat local_c0;
  
  if (name == (pchar *)0x0) {
    pcVar6 = "Invalid input argument";
    pVar1 = 0x25f;
LAB_0010b711:
    p_error_set_error_p(error,pVar1,0,pcVar6);
    return (PShm *)0x0;
  }
  shm = (PShm *)p_malloc0(0x30);
  if (shm == (PShm *)0x0) {
    pcVar6 = "Failed to allocate memory for shared segment";
    pVar1 = 0x25c;
    goto LAB_0010b711;
  }
  sVar5 = strlen(name);
  pcVar6 = (char *)p_malloc0(sVar5 + 0xe);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "Failed to allocate memory for segment name";
    pVar1 = 0x25c;
  }
  else {
    strcpy(pcVar6,name);
    sVar5 = strlen(pcVar6);
    builtin_strncpy(pcVar6 + sVar5,"_p_shm_object",0xe);
    ppVar7 = p_ipc_get_platform_key(pcVar6,1);
    shm->platform_key = ppVar7;
    shm->perms = perms;
    shm->size = size;
    p_free(pcVar6);
    if (shm->platform_key != (pchar *)0x0) {
      do {
        __fd = shm_open(shm->platform_key,0xc2,0x1b0);
        if (__fd != -1) {
          shm->shm_created = 1;
          iVar2 = ftruncate(__fd,shm->size);
          if (iVar2 != -1) {
            local_c0.st_size = shm->size;
            iVar2 = __fd;
            goto LAB_0010b667;
          }
          PVar3 = p_error_get_last_ipc();
          pVar1 = p_error_get_last_system();
          p_error_set_error_p(error,PVar3,pVar1,
                              "Failed to call ftruncate() to set memory segment size");
          pVar1 = p_sys_close(__fd);
          if (pVar1 == 0) goto LAB_0010b60c;
          pcVar6 = "PShm::pp_shm_create_handle: p_sys_close() failed(2)";
          goto LAB_0010b824;
        }
        pVar1 = p_error_get_last_system();
      } while (pVar1 == 4);
      pVar1 = p_error_get_last_system();
      if (pVar1 == 0x11) {
LAB_0010b5cd:
        iVar2 = shm_open(shm->platform_key,2,0x1b0);
        if (iVar2 == -1) goto code_r0x0010b5e3;
        iVar4 = fstat(iVar2,&local_c0);
        if (iVar4 == -1) {
          PVar3 = p_error_get_last_ipc();
          pVar1 = p_error_get_last_system();
          p_error_set_error_p(error,PVar3,pVar1,"Failed to call fstat() to get memory segment size")
          ;
          pVar1 = p_sys_close(iVar2);
          if (pVar1 == 0) goto LAB_0010b60c;
          pcVar6 = "PShm::pp_shm_create_handle: p_sys_close() failed(1)";
          goto LAB_0010b824;
        }
        shm->size = local_c0.st_size;
LAB_0010b667:
        pvVar8 = mmap((void *)0x0,local_c0.st_size,
                      (uint)(shm->perms != P_SHM_ACCESS_READONLY) * 2 + 1,1,iVar2,0);
        shm->addr = pvVar8;
        if (pvVar8 == (void *)0xffffffffffffffff) {
          PVar3 = p_error_get_last_ipc();
          pVar1 = p_error_get_last_system();
          p_error_set_error_p(error,PVar3,pVar1,"Failed to call mmap() to map memory segment");
          shm->addr = (ppointer)0x0;
          pVar1 = p_sys_close(iVar2);
          if (pVar1 != 0) {
            pcVar6 = "PShm::pp_shm_create_handle: p_sys_close() failed(3)";
LAB_0010b824:
            printf("** Warning: %s **\n",pcVar6);
          }
        }
        else {
          pVar1 = p_sys_close(iVar2);
          if (pVar1 != 0) {
            printf("** Warning: %s **\n","PShm::pp_shm_create_handle: p_sys_close() failed(4)");
          }
          pPVar9 = p_semaphore_new(shm->platform_key,1,(uint)(__fd != -1),error);
          shm->sem = pPVar9;
          if (pPVar9 != (PSemaphore *)0x0) {
            if (size == 0) {
              return shm;
            }
            if (shm->size <= size) {
              return shm;
            }
            shm->size = size;
            return shm;
          }
        }
      }
      else {
LAB_0010b5ed:
        PVar3 = p_error_get_last_ipc();
        pVar1 = p_error_get_last_system();
        p_error_set_error_p(error,PVar3,pVar1,"Failed to call shm_open() to create memory segment");
      }
LAB_0010b60c:
      pp_shm_clean_handle(shm);
      goto LAB_0010b614;
    }
    pcVar6 = "Invalid input argument";
    pVar1 = 0x25f;
  }
  p_error_set_error_p(error,pVar1,0,pcVar6);
LAB_0010b614:
  p_shm_free(shm);
  return (PShm *)0x0;
code_r0x0010b5e3:
  pVar1 = p_error_get_last_system();
  if (pVar1 != 4) goto LAB_0010b5ed;
  goto LAB_0010b5cd;
}

Assistant:

P_LIB_API PShm *
p_shm_new (const pchar		*name,
	   psize		size,
	   PShmAccessPerms	perms,
	   PError		**error)
{
	PShm	*ret;
	pchar	*new_name;

	if (P_UNLIKELY (name == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PShm))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for shared segment");
		return NULL;
	}

	if (P_UNLIKELY ((new_name = p_malloc0 (strlen (name) + strlen (P_SHM_SUFFIX) + 1)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for segment name");
		p_shm_free (ret);
		return NULL;
	}

	strcpy (new_name, name);
	strcat (new_name, P_SHM_SUFFIX);

#if defined (P_OS_IRIX) || defined (P_OS_TRU64)
	/* IRIX and Tru64 prefer filename styled IPC names */
	ret->platform_key = p_ipc_get_platform_key (new_name, FALSE);
#else
	ret->platform_key = p_ipc_get_platform_key (new_name, TRUE);
#endif
	ret->perms = perms;
	ret->size  = size;

	p_free (new_name);

	if (P_UNLIKELY (pp_shm_create_handle (ret, error) == FALSE)) {
		p_shm_free (ret);
		return NULL;
	}

	if (P_LIKELY (ret->size > size && size != 0))
		ret->size = size;

	return ret;
}